

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_dry_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  int *piVar4;
  pointer ppVar5;
  size_type sVar6;
  reference pvVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  long lVar10;
  long *in_RSI;
  long in_RDI;
  double dVar11;
  __type_conflict1 _Var12;
  float penalty;
  int repeat_exp;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it_2;
  bool is_single_token_breaker;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  range;
  iterator *af_kvp;
  size_t i_3;
  int max_exponent;
  float FLOAT_MAX_LOG;
  iterator *it_1;
  llama_token token_1;
  int repeat_len;
  int i_2;
  int n_2;
  int i_1;
  int n_1;
  int right_part_len;
  int p;
  int n;
  int k;
  int lt;
  int rt;
  int last;
  int offset;
  bool match;
  int seq_len;
  _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false> it;
  int longest_match;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  its;
  llama_token token;
  int i;
  int rep_limit;
  int last_n_repeat;
  int32_t effective_dry_penalty_last_n;
  llama_sampler_dry *ctx;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffffe98;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffea0;
  unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int local_114;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
  local_108;
  byte local_f9;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  local_f8;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_e8;
  undefined1 local_e0 [32];
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_c0;
  vector<int,_std::allocator<int>_> local_b8;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  byte local_65;
  int local_64;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_60
  ;
  int local_54;
  _Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false> local_50
  ;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>_>
  local_48;
  int local_38;
  int local_34;
  int local_30 [3];
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  long *local_10;
  
  local_18 = *(int **)(in_RDI + 8);
  if (((((float)local_18[1] != 0.0) || (NAN((float)local_18[1]))) &&
      (1.0 < (float)local_18[2] || (float)local_18[2] == 1.0)) && (local_18[4] != 0)) {
    local_10 = in_RSI;
    if (local_18[4] == -1) {
      local_114 = *local_18;
    }
    else {
      local_20 = 0;
      piVar4 = std::max<int>(local_18 + 4,&local_20);
      local_114 = *piVar4;
    }
    local_1c = local_114;
    sVar3 = ring_buffer<int>::size((ring_buffer<int> *)(local_18 + 0x28));
    local_30[2] = (int)sVar3;
    piVar4 = std::min<int>(local_30 + 2,&local_1c);
    piVar4 = std::min<int>(piVar4,local_18);
    local_24 = *piVar4;
    if (local_18[3] < local_24) {
      local_30[1] = 0;
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 (size_type)in_stack_fffffffffffffe98,(value_type_conflict3 *)0x520f6e);
      std::
      unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)0x520f7f);
      local_30[0] = local_24;
      for (local_34 = 0; local_34 < local_24; local_34 = local_34 + 1) {
        piVar4 = ring_buffer<int>::rat
                           ((ring_buffer<int> *)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
        local_38 = *piVar4;
        local_48 = std::
                   unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::equal_range(in_stack_fffffffffffffea0,(key_type *)in_stack_fffffffffffffe98);
        local_50._M_cur =
             (__node_type *)
             std::
             unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::end((unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)in_stack_fffffffffffffe98);
        bVar2 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                            *)&local_48,&local_50);
        if (!bVar2) {
          local_54 = -1;
          local_60 = local_48.first.
                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                     ._M_cur;
          while (bVar2 = std::__detail::operator!=
                                   (&local_60,
                                    &local_48.second.
                                     super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                   ), bVar2) {
            ppVar5 = std::__detail::
                     _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                                   *)0x521087);
            sVar6 = std::vector<int,_std::allocator<int>_>::size(&ppVar5->second);
            local_64 = (int)sVar6;
            if ((local_54 < local_64) && (local_64 <= local_34)) {
              local_65 = 1;
              for (local_6c = 0; local_6c < local_64; local_6c = local_6c + 1) {
                ppVar5 = std::__detail::
                         _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                         ::operator->((_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                                       *)0x5210f2);
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&ppVar5->second,(long)local_6c);
                iVar1 = *pvVar7;
                piVar4 = ring_buffer<int>::rat
                                   ((ring_buffer<int> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
                if (iVar1 != *piVar4) {
                  local_65 = 0;
                  break;
                }
              }
              if ((local_65 & 1) != 0) {
                local_54 = local_64;
              }
            }
            std::__detail::
            _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
            ::operator++((_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                          *)in_stack_fffffffffffffea0);
          }
          if (-1 < local_54) {
            local_30[0] = local_34 - local_54;
            break;
          }
        }
      }
      if (local_18[3] <= local_30[0]) {
        local_70 = local_24 + -1;
        local_74 = 0;
        local_78 = 0;
        for (local_7c = 1; local_7c < local_24; local_7c = local_7c + 1) {
          if (local_74 < local_7c) {
            local_80 = 0;
            while( true ) {
              bVar2 = false;
              if (local_80 + local_7c < local_24) {
                piVar4 = ring_buffer<int>::rat
                                   ((ring_buffer<int> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
                iVar1 = *piVar4;
                piVar4 = ring_buffer<int>::rat
                                   ((ring_buffer<int> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
                bVar2 = iVar1 == *piVar4;
              }
              if (!bVar2) break;
              local_80 = local_80 + 1;
            }
            piVar4 = std::min<int>(&local_80,local_30);
            iVar1 = *piVar4;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),
                                (long)(local_70 - local_7c));
            *pvVar7 = iVar1;
            if (0 < local_80) {
              local_78 = local_7c;
              local_74 = local_7c + local_80 + -1;
            }
          }
          else {
            local_84 = local_7c - local_78;
            local_88 = (local_74 - local_7c) + 1;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),
                                (long)(local_70 - local_84));
            iVar1 = local_74;
            if (*pvVar7 < local_88) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),
                                  (long)(local_70 - local_84));
              piVar4 = std::min<int>(pvVar7,local_30);
              iVar1 = *piVar4;
              local_8c = iVar1;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),
                                  (long)(local_70 - local_7c));
              *pvVar7 = iVar1;
            }
            else {
              do {
                local_90 = iVar1 + 1;
                bVar2 = false;
                if (local_90 < local_24) {
                  piVar4 = ring_buffer<int>::rat
                                     ((ring_buffer<int> *)
                                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                      CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8))
                  ;
                  in_stack_fffffffffffffec4 = *piVar4;
                  piVar4 = ring_buffer<int>::rat
                                     ((ring_buffer<int> *)
                                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                      CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8))
                  ;
                  bVar2 = in_stack_fffffffffffffec4 == *piVar4;
                }
                iVar1 = local_90;
              } while (bVar2);
              local_98 = local_90 - local_7c;
              piVar4 = std::min<int>(&local_98,local_30);
              in_stack_fffffffffffffec0 = *piVar4;
              local_94 = in_stack_fffffffffffffec0;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),
                                  (long)(local_70 - local_7c));
              *pvVar7 = in_stack_fffffffffffffec0;
              local_78 = local_7c;
              local_74 = local_90 + -1;
            }
          }
        }
        for (local_9c = 0; local_9c < local_24 + -1; local_9c = local_9c + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_18 + 0x14),(long)local_9c)
          ;
          local_a0 = *pvVar7;
          if (local_18[3] <= local_a0) {
            piVar4 = ring_buffer<int>::rat
                               ((ring_buffer<int> *)
                                CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_ = *piVar4;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)std::
                                unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                ::find(in_stack_fffffffffffffe98,(key_type *)0x521604);
            in_stack_fffffffffffffeb0 = &local_b8;
            local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)in_stack_fffffffffffffeb0;
            local_c0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 ::end(in_stack_fffffffffffffe98);
            bVar2 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_int,_int>,_false> *)
                               in_stack_fffffffffffffeb0,&local_c0);
            in_stack_fffffffffffffebf = true;
            if (!bVar2) {
              ppVar8 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::
                       operator->((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)
                                  0x52166e);
              in_stack_fffffffffffffebf = ppVar8->second < local_a0;
            }
            iVar1 = local_a0;
            if ((bool)in_stack_fffffffffffffebf != false) {
              pmVar9 = std::
                       unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       ::operator[]((unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                     *)in_stack_fffffffffffffea0,
                                    (key_type *)in_stack_fffffffffffffe98);
              *pmVar9 = iVar1;
            }
          }
        }
        local_e0._28_4_ = 0x42b17218;
        local_e0._24_4_ = 0;
        if (1.000001 < (float)local_18[2]) {
          dVar11 = std::log((double)(ulong)(uint)local_18[2]);
          local_e0._24_4_ = (undefined4)(88.72284 / SUB84(dVar11,0));
        }
        for (local_e0._16_8_ = (_Hash_node_base *)0x0;
            (ulong)local_e0._16_8_ < (_Hash_node_base *)local_10[1];
            local_e0._16_8_ = (long)(_Hash_node_base **)local_e0._16_8_ + 1) {
          local_e0._0_8_ =
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::find(in_stack_fffffffffffffe98,(key_type *)0x52177d);
          this = (unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)local_e0;
          local_e0._8_8_ = this;
          local_e8._M_cur =
               (__node_type *)
               std::
               unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
               ::end(in_stack_fffffffffffffe98);
          bVar2 = std::__detail::operator!=
                            ((_Node_iterator_base<std::pair<const_int,_int>,_false> *)this,&local_e8
                            );
          if (bVar2) {
            local_f8 = std::
                       unordered_multimap<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       ::equal_range(this,(key_type *)in_stack_fffffffffffffe98);
            local_f9 = 0;
            local_108 = local_f8.first.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                        ._M_cur;
            while (bVar2 = std::__detail::operator!=
                                     (&local_108,
                                      &local_f8.second.
                                       super__Node_iterator_base<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false>
                                     ), bVar2) {
              std::__detail::
              _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
              ::operator->((_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                            *)0x52183a);
              bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffeb0);
              if (bVar2) {
                local_f9 = 1;
                break;
              }
              std::__detail::
              _Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
              ::operator++((_Node_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_false,_false>
                            *)this);
            }
            if ((local_f9 & 1) == 0) {
              std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                        ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)0x521879);
              in_stack_fffffffffffffe98 =
                   (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    *)(double)(float)local_18[1];
              _Var12 = std::pow<float,int>(0.0,0x5218d9);
              lVar10 = *local_10 + local_e0._16_8_ * 0xc;
              *(float *)(lVar10 + 4) =
                   *(float *)(lVar10 + 4) - (float)((double)in_stack_fffffffffffffe98 * _Var12);
            }
          }
        }
        *(undefined1 *)(local_10 + 3) = 0;
      }
    }
  }
  return;
}

Assistant:

static void llama_sampler_dry_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_dry *) smpl->ctx;

    if (ctx->dry_multiplier == 0.0f || ctx->dry_base < 1.0f || ctx->dry_penalty_last_n == 0) {
        return;
    }

    int32_t effective_dry_penalty_last_n = (ctx->dry_penalty_last_n == -1) ? ctx->total_context_size : std::max(ctx->dry_penalty_last_n, 0);
    int last_n_repeat = std::min(std::min((int)ctx->last_tokens.size(), effective_dry_penalty_last_n), ctx->total_context_size);

    if (last_n_repeat <= ctx->dry_allowed_length) {
        return;
    }

    ctx->dry_repeat_count.assign(last_n_repeat, 0);
    ctx->dry_max_token_repeat.clear();

    // Step 1: Look for restart sequences to limit the maximum repetition length.
    // Work backwards through the context looking for any token that begins a restart sequence.
    //
    // The collection `restart_sequences` is a mapping from a "head" token to all "tail"
    // sequences that together comprise a restart sequence. This allows us to quickly check
    // whether each token is the head of a complete sequence. Most restart sequences are actually
    // a single token, and for these the "tail" is an empty vector.
    //
    // If the token is a "head", test all restart sequences that begin with this token
    // (there will often only be one sequence for each token, but if sequences like 'aaaq1' and
    // 'aaa1' are used as restart strings, both could start with 'aaa' when tokenized). The
    // longest matching sequence (if any) is used to limit the maximum repetition length.
    //
    // Note that in the case case of a short sequence contained in a longer one, this might fail to
    // find the smallest value for `rep_limit`. For example, if 'amniotic' and 'ni' are both used as
    // restart sequences, 'ni' will be found first, and since it's shorter it will fail to suppress
    // 'otic'. This is a minor issue since fully contained restart sequences are likely to be rare.
    //
    // This is theoretically worst-case O(N^2) for arbitrary restart sequences, which is why we
    // have already clamped the maximum tail sequence length when generating `restart_sequences`.
    // With clamping, this scan is O(N) in the context length.

    int rep_limit = last_n_repeat;
    for (int i = 0; i < last_n_repeat; ++i) {
        llama_token token = ctx->last_tokens.rat(i);
        auto its = ctx->dry_processed_breakers.equal_range(token);
        if (its.first == ctx->dry_processed_breakers.end()) {
            continue;
        }
        int longest_match = -1;
        for (auto it = its.first; it != its.second; ++it) {
            // Note that (*it) does not contain the head character, so seq_len will be
            // the restart sequence length minus 1.
            // In the common case of a single-token restart sequence, (*it) will be empty
            // and we will trivially match.
            int seq_len = (int)it->second.size();
            if (seq_len > longest_match && seq_len <= (int)i) {
                bool match = true;
                for (int offset = 0; offset < seq_len; ++offset) {
                    // The -1 when indexing `last_tokens` is because we already matched the head.
                    if (it->second[offset] != ctx->last_tokens.rat(i - offset - 1)) {
                        match = false;
                        break;
                    }
                }
                if (match) {
                    longest_match = seq_len;
                }
            }
        }
        if (longest_match >= 0) {
            // We found a restart sequence starting `i` tokens from the end and continuing for
            // `longest_match` tokens.
            rep_limit = i - longest_match;
            break;
        }
    }
    if (rep_limit < ctx->dry_allowed_length) {
        return;
    }

    // Step 2: Iterate in reverse over the last N tokens of the context, using the "Z-algorithm" (in
    // the reverse direction) to efficiently compute the positions and lengths of suffixes appearing
    // elsewhere in the context. We limit the suffix length to `rep_limit` to respect restart sequences.
    //
    // This algorithm is not currently documented on Wikipedia, but there is a clear description here:
    // https://ivanyu.me/blog/2014/10/15/z-algorithm/
    //
    // The code below is adapted from the public domain implementation by the same author here:
    // https://github.com/ivanyu/string-algorithms/blob/master/z_algorithm.py
    //
    // Example:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //                    ^
    //   This `3` means that the last three tokens of the context (a b c) also appear here.
    //
    // This step is worst case O(N) since the Z-algorithm is linear, despite the appearance of nested
    // for/while loops. This can be seen by observing that the `lt` and `rt` bounds are set after each
    // repeated suffix is detected (i.e. after each while loop when n > 0). These bound variables
    // ensure that the inner while loops only examine each token in the context once as the outer
    // for loop iterates over the context.

    {
        const int last = last_n_repeat - 1;
        int rt = 0, lt = 0;

        for (int k = 1; k < last_n_repeat; ++k) {
            if (k > rt) {
                // If k is outside the current Z-box, do naive computation.
                int n = 0;
                while (n + k < last_n_repeat && ctx->last_tokens.rat(n) == ctx->last_tokens.rat(n+k)) {
                    ++n;
                }
                ctx->dry_repeat_count[last - k] = std::min(n, rep_limit);
                if (n > 0) {
                    lt = k;
                    rt = k + n - 1;
                }
            } else {
                // If k is inside the current Z-box, consider two cases.

                int p = k - lt; // Pair index.
                int right_part_len = rt - k + 1;

                if (ctx->dry_repeat_count[last - p] < right_part_len) {
                    int n = std::min(ctx->dry_repeat_count[last - p], rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                } else {
                    int i = rt + 1;
                    while (i < last_n_repeat && ctx->last_tokens.rat(i) == ctx->last_tokens.rat(i - k)) {
                        i += 1;
                    }

                    int n = std::min(i - k, rep_limit);
                    ctx->dry_repeat_count[last - k] = n;
                    lt = k;
                    rt = i - 1;
                }
            }
        }
    }

    // Step 3: Iterate over dry_repeat_count and last_tokens, examining the maximum repeat length
    // that would be generated by emitting each new token that would extend a sequence.
    //
    // Following the same example as above:
    // Last N tokens: a b c c b c y a b c
    // Repeat counts: 0 0 3 1 0 2 0 0 0 0
    //
    // For each non-zero, look ahead one token. This token, if emitted, would extend the repetition.
    // c: 3 -> 4 (from `a b c` to `a b c c`)
    // b: 1 -> 2 (from `c` to `c b`)
    // y: 2 -> 3 (from `b c` to `b c y`)

    for (int i = 0; i < last_n_repeat - 1; ++i) {
        int repeat_len = ctx->dry_repeat_count[i];
        if (repeat_len >= ctx->dry_allowed_length) {
            // This token ends a repeat, so the next token would continue one.
            // By convention, the value of `repeat_len` only includes the tokens currently
            // in the context, not the new token that would be added.
            llama_token token = ctx->last_tokens.rat(last_n_repeat - 2 - i);
            // Track the maximum sequence ending in this token.
            const auto& it = ctx->dry_max_token_repeat.find(token);
            if (it == ctx->dry_max_token_repeat.end() || it->second < repeat_len) {
                ctx->dry_max_token_repeat[token] = repeat_len;
            }
        }
    }

    // Step 4: Apply logit penalties based on the maximum repeat length for relevant tokens.

    // Prevent floating point overflow in `pow(penalty_base, exponent)` by clamping to `max_exponent`.
    // Compute it from `penalty_base` and the approximate log of `std::numeric_limits<float>::max()`
    const float FLOAT_MAX_LOG = 88.7228391f;
    int max_exponent = 0;
    if (ctx->dry_base > 1.000001f) {
        max_exponent = FLOAT_MAX_LOG / std::log(ctx->dry_base);
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        const auto& af_kvp = ctx->dry_max_token_repeat.find(cur_p->data[i].id);
        if (af_kvp != ctx->dry_max_token_repeat.end()) {
            // Check all sequence breakers starting with this token
            auto range = ctx->dry_processed_breakers.equal_range(cur_p->data[i].id);
            bool is_single_token_breaker = false;

            for (auto it = range.first; it != range.second; ++it) {
                if (it->second.empty()) {
                    is_single_token_breaker = true;
                    break;
                }
            }

            // Apply penalty only if it's not a single-token sequence breaker
            if (!is_single_token_breaker) {
                int repeat_exp = af_kvp->second - ctx->dry_allowed_length;
                if (max_exponent > 0 && repeat_exp > max_exponent) {
                    repeat_exp = max_exponent;
                }
                float penalty = ctx->dry_multiplier * std::pow(ctx->dry_base, repeat_exp);
                cur_p->data[i].logit -= penalty;
            }
        }
    }

    cur_p->sorted = false;
}